

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractTypeRefining.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_22::AbstractTypeRefining::run(AbstractTypeRefining *this,Module *module)

{
  Types *__ht;
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  PassRunner *pPVar1;
  pointer puVar2;
  Global *pGVar3;
  pointer puVar4;
  pointer ppEVar5;
  pointer puVar6;
  DataSegment *pDVar7;
  pointer pHVar8;
  __buckets_ptr pp_Var9;
  HeapTypeKind HVar10;
  BasicHeapType BVar11;
  _Rb_tree_node_base *p_Var12;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar13;
  const_iterator cVar14;
  iterator iVar15;
  mapped_type *pmVar16;
  uintptr_t uVar17;
  const_iterator __begin2;
  undefined1 auVar18 [8];
  ElementSegment *pEVar19;
  __hashtable *__h;
  uintptr_t *puVar20;
  pointer ppEVar21;
  _Base_ptr p_Var22;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *curr;
  pointer puVar23;
  pointer puVar24;
  pointer pHVar25;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr_1;
  pointer puVar26;
  HeapType HVar27;
  undefined1 auStack_2f8 [8];
  Types abstractTypes;
  _Any_data local_168;
  code *local_158;
  code *local_150;
  undefined1 local_140 [8];
  SubTypes subTypes;
  ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
  analysis;
  HeapType type_1;
  long local_a8;
  __node_base_ptr p_Stack_88;
  key_type local_80;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_78;
  key_type local_70;
  HeapType subType;
  __hashtable *__h_2;
  HeapType type_2;
  
  if (((module->features).features & 0x400) != 0) {
    pPVar1 = (this->super_Pass).runner;
    if ((pPVar1->options).closedWorld == false) {
      Fatal::Fatal((Fatal *)auStack_2f8);
      Fatal::operator<<((Fatal *)auStack_2f8,
                        (char (*) [45])"AbstractTypeRefining requires --closed-world");
      Fatal::~Fatal((Fatal *)auStack_2f8);
    }
    this->trapsNeverHappen = (pPVar1->options).trapsNeverHappen;
    __ht = &this->createdTypes;
    auStack_2f8 = (undefined1  [8])0x0;
    abstractTypes._M_h._M_buckets = (__buckets_ptr)0x0;
    puVar23 = (module->globals).
              super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (module->globals).
             super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    subType.id = (uintptr_t)this;
    if (puVar23 != puVar2) {
      do {
        pGVar3 = (puVar23->_M_t).
                 super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                 super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
        if (*(char **)((long)&(pGVar3->super_Importable).module + 8) == (char *)0x0) {
          Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
          ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                  *)auStack_2f8,&pGVar3->init);
        }
        puVar23 = puVar23 + 1;
      } while (puVar23 != puVar2);
    }
    puVar26 = (module->elementSegments).
              super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (module->elementSegments).
             super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar26 != puVar4) {
      do {
        pEVar19 = (puVar26->_M_t).
                  super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                  .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        if (pEVar19->offset != (Expression *)0x0) {
          Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
          ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                  *)auStack_2f8,&pEVar19->offset);
          pEVar19 = (puVar26->_M_t).
                    super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl;
        }
        ppEVar5 = *(pointer *)
                   ((long)&(pEVar19->data).
                           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                           ._M_impl + 8);
        for (ppEVar21 = (pEVar19->data).
                        super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                        _M_impl.super__Vector_impl_data._M_start; ppEVar21 != ppEVar5;
            ppEVar21 = ppEVar21 + 1) {
          local_140 = (undefined1  [8])*ppEVar21;
          Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
          ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                  *)auStack_2f8,(Expression **)local_140);
        }
        puVar26 = puVar26 + 1;
      } while (puVar26 != puVar4);
    }
    puVar24 = (module->dataSegments).
              super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (module->dataSegments).
             super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar24 != puVar6) {
      do {
        pDVar7 = (puVar24->_M_t).
                 super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                 .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
        if (pDVar7->offset != (Expression *)0x0) {
          Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
          ::walk((Walker<wasm::(anonymous_namespace)::NewFinder,_wasm::Visitor<wasm::(anonymous_namespace)::NewFinder,_void>_>
                  *)auStack_2f8,&pDVar7->offset);
        }
        puVar24 = puVar24 + 1;
      } while (puVar24 != puVar6);
    }
    local_168._M_unused._M_object = (void *)0x0;
    local_168._8_8_ = 0;
    local_150 = std::
                _Function_handler<void_(wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AbstractTypeRefining.cpp:97:16)>
                ::_M_invoke;
    local_158 = std::
                _Function_handler<void_(wasm::Function_*,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/AbstractTypeRefining.cpp:97:16)>
                ::_M_manager;
    wasm::ModuleUtils::
    ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
    ::ParallelFunctionAnalysis
              ((ParallelFunctionAnalysis<std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>
                *)&subTypes.typeSubTypes._M_h._M_single_bucket,module,(Func *)&local_168);
    if (local_158 != (code *)0x0) {
      (*local_158)(&local_168,&local_168,__destroy_functor);
    }
    if ((undefined1 *)analysis._24_8_ != &analysis.field_0x8) {
      p_Var12 = (_Rb_tree_node_base *)analysis._24_8_;
      do {
        for (p_Var22 = p_Var12[1]._M_right; p_Var22 != (_Base_ptr)0x0;
            p_Var22 = *(_Base_ptr *)p_Var22) {
          local_140 = (undefined1  [8])p_Var22->_M_parent;
          auStack_2f8 = (undefined1  [8])__ht;
          std::
          _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                    ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)__ht,local_140,auStack_2f8);
        }
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      } while (p_Var12 != (_Rb_tree_node_base *)&analysis.field_0x8);
    }
    wasm::ModuleUtils::getPublicHeapTypes
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_2f8,module);
    pp_Var9 = abstractTypes._M_h._M_buckets;
    if (auStack_2f8 != (undefined1  [8])abstractTypes._M_h._M_buckets) {
      auVar18 = auStack_2f8;
      do {
        analysis._48_8_ = (((Types *)auVar18)->_M_h)._M_buckets;
        local_140 = (undefined1  [8])__ht;
        std::
        _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                  ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)__ht,&analysis.field_0x30,local_140);
        auVar18 = (undefined1  [8])&(((Types *)auVar18)->_M_h)._M_bucket_count;
      } while (auVar18 != (undefined1  [8])pp_Var9);
    }
    HVar27.id = subType.id;
    if (auStack_2f8 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_2f8,abstractTypes._M_h._M_bucket_count - (long)auStack_2f8);
    }
    SubTypes::SubTypes((SubTypes *)local_140,module);
    this_00 = (_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)(HVar27.id + 0x90);
    std::
    _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)this_00,&__ht->_M_h);
    SubTypes::getSubTypesFirstSort
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_2f8,
               (SubTypes *)local_140);
    pp_Var9 = abstractTypes._M_h._M_buckets;
    if (auStack_2f8 != (undefined1  [8])abstractTypes._M_h._M_buckets) {
      auVar18 = auStack_2f8;
      do {
        __h_2 = (__hashtable *)(((Types *)auVar18)->_M_h)._M_buckets;
        pvVar13 = SubTypes::getImmediateSubTypes((SubTypes *)local_140,(HeapType)__h_2);
        pHVar8 = (pvVar13->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pHVar25 = (pvVar13->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                       )._M_impl.super__Vector_impl_data._M_start; pHVar25 != pHVar8;
            pHVar25 = pHVar25 + 1) {
          local_70.id = pHVar25->id;
          cVar14 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find(this_00,&local_70);
          if (cVar14.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0) {
            analysis._48_8_ = this_00;
            std::
            _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                      ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)this_00,&__h_2,&analysis.field_0x30);
            break;
          }
        }
        auVar18 = (undefined1  [8])&(((Types *)auVar18)->_M_h)._M_bucket_count;
        HVar27.id = subType.id;
      } while (auVar18 != (undefined1  [8])pp_Var9);
    }
    if (auStack_2f8 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_2f8,abstractTypes._M_h._M_bucket_count - (long)auStack_2f8);
    }
    pHVar25 = subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (*(char *)(HVar27.id + 0x100) != '\0') {
      auStack_2f8 = (undefined1  [8])&abstractTypes._M_h._M_rehash_policy._M_next_resize;
      abstractTypes._M_h._M_buckets = (__buckets_ptr)0x1;
      abstractTypes._M_h._M_bucket_count = 0;
      abstractTypes._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      abstractTypes._M_h._M_element_count._0_4_ = 0x3f800000;
      abstractTypes._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      abstractTypes._M_h._M_rehash_policy._4_4_ = 0;
      abstractTypes._M_h._M_rehash_policy._M_next_resize = 0;
      if (local_140 !=
          (undefined1  [8])
          subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
          .super__Vector_impl_data._M_start) {
        auVar18 = local_140;
        do {
          __h_2 = *(__hashtable **)&((_Base_ptr)auVar18)->_M_color;
          cVar14 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find(&__ht->_M_h,(key_type *)&__h_2);
          if (cVar14.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0) {
            analysis._48_8_ =
                 (_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)auStack_2f8;
            std::
            _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
            ::
            _M_insert<wasm::HeapType_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::HeapType,true>>>>
                      ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                        *)auStack_2f8,(key_type *)&__h_2,&analysis.field_0x30);
          }
          auVar18 = (undefined1  [8])&((_Base_ptr)auVar18)->_M_parent;
        } while (auVar18 != (undefined1  [8])pHVar25);
      }
      SubTypes::getSubTypesFirstSort
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&analysis.field_0x30,
                 (SubTypes *)local_140);
      if (analysis._48_8_ != type_1.id) {
        local_78 = (_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(subType.id + 200);
        puVar20 = (uintptr_t *)analysis._48_8_;
        do {
          local_70.id = *puVar20;
          cVar14 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)auStack_2f8,&local_70);
          if (cVar14.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0) {
            type_2.id = type_2.id & 0xffffffffffffff00;
            pvVar13 = SubTypes::getImmediateSubTypes((SubTypes *)local_140,(HeapType)local_70.id);
            pHVar25 = (pvVar13->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
            pHVar8 = (pvVar13->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            if ((long)pHVar8 - (long)pHVar25 == 8) {
              __h_2 = (__hashtable *)pHVar25->id;
              if ((char)type_2.id == '\0') {
                type_2.id._0_1_ = 1;
              }
            }
            else {
              for (; pHVar25 != pHVar8; pHVar25 = pHVar25 + 1) {
                local_80.id = pHVar25->id;
                cVar14 = std::
                         _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::find(this_00,&local_80);
                if (cVar14.super__Node_iterator_base<wasm::HeapType,_true>._M_cur !=
                    (__node_type *)0x0) {
                  if ((char)type_2.id != '\0') {
                    type_2.id = (ulong)type_2.id._1_7_ << 8;
                    break;
                  }
                  type_2.id._0_1_ = 1;
                  __h_2 = (__hashtable *)local_80.id;
                }
              }
            }
            if ((char)type_2.id == '\x01') {
              iVar15 = std::
                       _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(local_78,(key_type *)&__h_2);
              if (iVar15.
                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
                  _M_cur != (__node_type *)0x0) {
                __h_2 = *(__hashtable **)
                         ((long)iVar15.
                                super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                                ._M_cur + 0x10);
              }
              pmVar16 = std::__detail::
                        _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_78,&local_70);
              pmVar16->id = (uintptr_t)__h_2;
            }
          }
          puVar20 = puVar20 + 1;
        } while (puVar20 != (uintptr_t *)type_1.id);
      }
      HVar27.id = subType.id;
      if (analysis._48_8_ != 0) {
        operator_delete((void *)analysis._48_8_,local_a8 - analysis._48_8_);
      }
      std::
      _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)auStack_2f8);
    }
    analysis._48_8_ = &p_Stack_88;
    p_Stack_88 = (__node_base_ptr)0x0;
    if (local_140 !=
        (undefined1  [8])
        subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start) {
      auVar18 = local_140;
      do {
        auStack_2f8 = *(undefined1 (*) [8])&((_Base_ptr)auVar18)->_M_color;
        HVar10 = HeapType::getKind((HeapType *)auStack_2f8);
        if (HVar10 == Struct) {
          cVar14 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find(this_00,(HeapType *)auStack_2f8);
          if (cVar14.super__Node_iterator_base<wasm::HeapType,_true>._M_cur == (__node_type *)0x0) {
            BVar11 = HeapType::getBottom((HeapType *)auStack_2f8);
            pmVar16 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&analysis.field_0x30,(HeapType *)auStack_2f8);
            uVar17 = (uintptr_t)BVar11;
          }
          else {
            iVar15 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)(HVar27.id + 200),(HeapType *)auStack_2f8);
            if (iVar15.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
                _M_cur == (__node_type *)0x0) goto LAB_00793974;
            pmVar16 = std::__detail::
                      _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)&analysis.field_0x30,(HeapType *)auStack_2f8);
            uVar17 = *(uintptr_t *)
                      ((long)iVar15.
                             super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                             ._M_cur + 0x10);
          }
          pmVar16->id = uVar17;
        }
LAB_00793974:
        auVar18 = (undefined1  [8])&((_Base_ptr)auVar18)->_M_parent;
      } while (auVar18 !=
               (undefined1  [8])
               subTypes.types.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&analysis.field_0x30);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&subTypes.types.
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    if (local_140 != (undefined1  [8])0x0) {
      operator_delete((void *)local_140,
                      (long)subTypes.types.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)local_140);
    }
    std::
    _Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<wasm::Function_*,_std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>,_std::_Select1st<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>,_std::less<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_std::unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>_>_>_>
                 *)&analysis);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    if (!getPassOptions().closedWorld) {
      Fatal() << "AbstractTypeRefining requires --closed-world";
    }

    trapsNeverHappen = getPassOptions().trapsNeverHappen;

    // First, find all the created types (that have a struct.new) both in module
    // code and in functions.
    NewFinder(createdTypes).walkModuleCode(module);

    ModuleUtils::ParallelFunctionAnalysis<Types> analysis(
      *module, [&](Function* func, Types& types) {
        if (!func->imported()) {
          NewFinder(types).walk(func->body);
        }
      });

    for (auto& [_, types] : analysis.map) {
      for (auto type : types) {
        createdTypes.insert(type);
      }
    }

    // Assume all public types are created, which makes them non-abstract and
    // hence ignored below.
    // TODO: In principle we could assume such types are not created outside the
    //       module, given closed world, but we'd also need to make sure that
    //       we don't need to make any changes to public types that refer to
    //       them.
    for (auto type : ModuleUtils::getPublicHeapTypes(*module)) {
      createdTypes.insert(type);
    }

    SubTypes subTypes(*module);

    // Compute createdTypesOrSubTypes by starting with the created types and
    // then propagating subtypes.
    createdTypesOrSubTypes = createdTypes;
    for (auto type : subTypes.getSubTypesFirstSort()) {
      // If any of our subtypes are created, so are we.
      for (auto subType : subTypes.getImmediateSubTypes(type)) {
        if (createdTypesOrSubTypes.count(subType)) {
          createdTypesOrSubTypes.insert(type);
          break;
        }
      }
    }

    if (trapsNeverHappen) {
      computeAbstractTypes(subTypes);
    }

    // Use what we found about abstract types and never-created types to
    // optimize.
    optimize(module, subTypes);
  }